

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O2

string * __thiscall
helics::NetworkBroker<helics::udp::UdpComms,(gmlc::networking::InterfaceTypes)1,7>::
generateLocalAddressString_abi_cxx11_
          (string *__return_storage_ptr__,
          NetworkBroker<helics::udp::UdpComms,(gmlc::networking::InterfaceTypes)1,7> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *networkInterface;
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_58;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = CommsInterface::isConnected(*(CommsInterface **)(this + 0xe78));
  if (bVar2) {
    NetworkCommsInterface::getAddress_abi_cxx11_
              (&sStack_58,*(NetworkCommsInterface **)(this + 0xe78));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  else {
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0xe88))->__data);
    networkInterface =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0xef0);
    lVar1 = *(long *)(this + 0xef8);
    if ((lVar1 == 0) || ((networkInterface->_M_dataplus)._M_p[lVar1 + -1] != '*')) {
      gmlc::networking::makePortAddress
                (&sStack_58,(string *)networkInterface,*(int *)(this + 0xf50));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(__return_storage_ptr__,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_58);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_38,networkInterface,0,lVar1 - 1);
      gmlc::networking::makePortAddress(&sStack_58,(string *)&local_38,*(int *)(this + 0xf50));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(__return_storage_ptr__,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_58);
      std::__cxx11::string::~string((string *)&sStack_58);
      this_00 = &local_38;
    }
    std::__cxx11::string::~string((string *)this_00);
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0xe88));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NetworkBroker<COMMS, baseline, tcode>::generateLocalAddressString() const
{
    using InterfaceTypes = gmlc::networking::InterfaceTypes;
    std::string add;
    if (CommsBroker<COMMS, CoreBroker>::comms->isConnected()) {
        add = CommsBroker<COMMS, CoreBroker>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CoreBroker::getIdentifier();
                }
                break;
        }
    }
    return add;
}